

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O1

void __thiscall
CsvModelSerialiserPrivate::CsvModelSerialiserPrivate
          (CsvModelSerialiserPrivate *this,CsvModelSerialiser *q)

{
  AbstractSingleRoleSerialiserPrivate::AbstractSingleRoleSerialiserPrivate
            (&this->super_AbstractSingleRoleSerialiserPrivate,&q->super_AbstractSingleRoleSerialiser
            );
  this->m_firstRowIsHeader = true;
  this->m_firstColumnIsHeader = true;
  QString::QString(&this->m_csvSeparator,(QChar)0x2c);
  return;
}

Assistant:

CsvModelSerialiserPrivate::CsvModelSerialiserPrivate(CsvModelSerialiser *q)
    : AbstractSingleRoleSerialiserPrivate(q)
    , m_firstRowIsHeader(true)
    , m_firstColumnIsHeader(true)
    , m_csvSeparator(QLatin1Char(','))
{ }